

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
cnn::Tensor::save<boost::archive::text_oarchive>(Tensor *this,text_oarchive *ar,uint param_3)

{
  Dim *in_RDI;
  Dim *in_stack_ffffffffffffffb8;
  float *t;
  
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            ((interface_oarchive<boost::archive::text_oarchive> *)in_RDI,in_stack_ffffffffffffffb8);
  t = *(float **)(in_RDI[1].d + 1);
  Dim::size(in_RDI);
  boost::serialization::make_array<float,unsigned_int>(t,(uint)((ulong)in_RDI >> 0x20));
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            ((interface_oarchive<boost::archive::text_oarchive> *)in_RDI,
             (array_wrapper<float> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    ar & d;
#if HAVE_CUDA
    float* vc = (float*)malloc(d.size() * sizeof(float));
    CUDA_CHECK(cudaMemcpy(vc, v, d.size() * sizeof(float), cudaMemcpyDeviceToHost));
    ar & boost::serialization::make_array(vc, d.size());
    free(vc);
#else
    ar & boost::serialization::make_array(v, d.size());
#endif
  }